

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextProcessUndockWindow
               (ImGuiContext *ctx,ImGuiWindow *window,bool clear_persistent_docking_ref)

{
  ImGuiID local_34;
  bool clear_persistent_docking_ref_local;
  ImGuiWindow *window_local;
  ImGuiContext *ctx_local;
  
  if (window->DockNode == (ImGuiDockNode *)0x0) {
    window->DockId = 0;
  }
  else {
    if (clear_persistent_docking_ref) {
      local_34 = 0;
    }
    else {
      local_34 = window->DockId;
    }
    DockNodeRemoveWindow(window->DockNode,window,local_34);
  }
  window->Collapsed = false;
  window->field_0x492 = window->field_0x492 & 0xfe;
  window->field_0x492 = window->field_0x492 & 0xfd;
  MarkIniSettingsDirty();
  return;
}

Assistant:

void ImGui::DockContextProcessUndockWindow(ImGuiContext* ctx, ImGuiWindow* window, bool clear_persistent_docking_ref)
{
    IMGUI_DEBUG_LOG_DOCKING("DockContextProcessUndockWindow window '%s', clear_persistent_docking_ref = %d\n", window->Name, clear_persistent_docking_ref);
    IM_UNUSED(ctx);
    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, clear_persistent_docking_ref ? 0 : window->DockId);
    else
        window->DockId = 0;
    window->Collapsed = false;
    window->DockIsActive = false;
    window->DockTabIsVisible = false;
    MarkIniSettingsDirty();
}